

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

void __thiscall
tcu::PixelBufferAccess::setPixStencil(PixelBufferAccess *this,int stencil,int x,int y,int z)

{
  ChannelType type;
  int iVar1;
  deUint8 *dst;
  
  dst = (deUint8 *)
        ((long)(this->super_ConstPixelBufferAccess).m_data +
        (long)(z * (this->super_ConstPixelBufferAccess).m_pitch.m_data[2]) +
        (long)(y * (this->super_ConstPixelBufferAccess).m_pitch.m_data[1]) +
        (long)(x * (this->super_ConstPixelBufferAccess).m_pitch.m_data[0]));
  type = (this->super_ConstPixelBufferAccess).m_format.type;
  if (type - UNSIGNED_INT_16_8_8 < 2) {
    iVar1 = 0xff;
    if ((uint)stencil < 0xff) {
      iVar1 = stencil;
    }
    *dst = (deUint8)iVar1;
    return;
  }
  if (type != UNSIGNED_INT_24_8_REV) {
    if (type == FLOAT_UNSIGNED_INT_24_8_REV) {
      iVar1 = 0xff;
      if ((uint)stencil < 0xff) {
        iVar1 = stencil;
      }
      dst[4] = (deUint8)iVar1;
      return;
    }
    anon_unknown_74::intToChannel(dst,stencil,type);
    return;
  }
  iVar1 = 0xff;
  if ((uint)stencil < 0xff) {
    iVar1 = stencil;
  }
  dst[3] = (deUint8)iVar1;
  return;
}

Assistant:

void PixelBufferAccess::setPixStencil (int stencil, int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, getWidth()));
	DE_ASSERT(de::inBounds(y, 0, getHeight()));
	DE_ASSERT(de::inBounds(z, 0, getDepth()));

	deUint8* const pixelPtr = (deUint8*)getPixelPtr(x, y, z);

	switch (m_format.type)
	{
		case TextureFormat::UNSIGNED_INT_16_8_8:
		case TextureFormat::UNSIGNED_INT_24_8:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			writeUint32Low8(pixelPtr, convertSat<deUint8>((deUint32)stencil));
			break;

		case TextureFormat::UNSIGNED_INT_24_8_REV:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			writeUint32High8(pixelPtr, convertSat<deUint8>((deUint32)stencil));
			break;

		case TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV:
			DE_ASSERT(m_format.order == TextureFormat::DS);
			writeUint32Low8(pixelPtr + 4, convertSat<deUint8>((deUint32)stencil));
			break;

		default:
			DE_ASSERT(m_format.order == TextureFormat::S);  // no other combined depth stencil types
			intToChannel(pixelPtr, stencil, m_format.type);
			break;
	}
}